

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_loop.cpp
# Opt level: O3

void __thiscall EventLoop::loop(EventLoop *this)

{
  uint uVar1;
  pthread_t in_RAX;
  Logger *pLVar2;
  longlong lVar3;
  undefined8 in_RCX;
  nfds_t in_RDX;
  nfds_t extraout_RDX;
  char *in_RSI;
  id local_38;
  
  this->el_quit = false;
  local_38._M_thread = in_RAX;
  do {
    uVar1 = Epoll::poll((this->el_epoller).super___shared_ptr<Epoll,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,(pollfd *)in_RSI,in_RDX,(int)in_RCX);
    pLVar2 = Logger::get_instance();
    if ((pLVar2->l_inited == false) && (-1 < pr_level)) {
      in_RSI = "error";
      in_RCX = 0x3e;
      printf("[%-5s][%s:%d] logger must be inited before user!\n","error","loop");
    }
    if (1 < (int)g_log_level) {
      pLVar2 = Logger::get_instance();
      local_38._M_thread = pthread_self();
      lVar3 = tid_to_ll(&local_38);
      in_RSI = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/event_loop.cpp"
      ;
      in_RCX = 0x3e;
      Logger::write_log(pLVar2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/event_loop.cpp"
                        ,"loop",0x3e,LOG_LEVEL_INFO,
                        "eventloop, tid %lld, loop once, epoll event cnt %d\n",lVar3,(ulong)uVar1);
      pLVar2 = Logger::get_instance();
      Logger::flush(pLVar2);
    }
    execute_task_funcs(this);
    in_RDX = extraout_RDX;
  } while (this->el_quit != true);
  return;
}

Assistant:

void EventLoop::loop() {
    el_quit = false;
    while (!el_quit) {
        auto cnt = el_epoller->poll();
LOG_INFO("eventloop, tid %lld, loop once, epoll event cnt %d\n", tid_to_ll(this_thread::get_id()), cnt);
        execute_task_funcs();
    }
}